

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

void sysbvm_type_setTotalSlotCount
               (sysbvm_context_t *context,sysbvm_tuple_t type,size_t totalSlotCount)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t totalSlotCount_local;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if ((_Var1) && (_Var1 = sysbvm_tuple_isDummyValue(type), !_Var1)) {
    sVar2 = sysbvm_tuple_size_encode(context,totalSlotCount);
    *(sysbvm_tuple_t *)(type + 0x58) = sVar2;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setTotalSlotCount(sysbvm_context_t *context, sysbvm_tuple_t type, size_t totalSlotCount)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;
    if(sysbvm_tuple_isDummyValue(type)) return;
    ((sysbvm_type_tuple_t*)type)->totalSlotCount = sysbvm_tuple_size_encode(context, totalSlotCount);
}